

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O0

int StopChrono(CHRONO *pChrono,double *pDuration)

{
  int iVar1;
  long lVar2;
  undefined1 local_30 [8];
  timespec temp;
  double *pDuration_local;
  CHRONO *pChrono_local;
  
  if (pChrono->Suspended == 0) {
    temp.tv_nsec = (__syscall_slong_t)pDuration;
    iVar1 = clock_gettime(4,(timespec *)local_30);
    if (iVar1 != 0) {
      return 1;
    }
    (pChrono->Finish).tv_sec = (__time_t)local_30;
    (pChrono->Finish).tv_nsec = temp.tv_sec;
    lVar2 = (pChrono->Duration).tv_nsec + temp.tv_sec;
    local_30 = (undefined1  [8])
               ((lVar2 / 1000000000 + (pChrono->Duration).tv_sec + (long)local_30) -
               (pChrono->Start).tv_sec);
    temp.tv_sec = lVar2 % 1000000000 - (pChrono->Start).tv_nsec;
    if (temp.tv_sec < 0) {
      local_30 = (undefined1  [8])(temp.tv_sec / 1000000000 + -1 + (long)local_30);
      temp.tv_sec = temp.tv_sec % 1000000000 + 1000000000;
    }
    (pChrono->Duration).tv_sec = (__time_t)local_30;
    (pChrono->Duration).tv_nsec = temp.tv_sec;
    *(double *)temp.tv_nsec =
         (double)(pChrono->Duration).tv_sec + (double)(pChrono->Duration).tv_nsec / 1000000000.0;
  }
  else {
    *pDuration = (double)(pChrono->Duration).tv_sec +
                 (double)(pChrono->Duration).tv_nsec / 1000000000.0;
  }
  return 0;
}

Assistant:

inline int StopChrono(CHRONO* pChrono, double* pDuration)
{
	struct timespec temp;

	if (pChrono->Suspended)
	{
		*pDuration = pChrono->Duration.tv_sec+(double)pChrono->Duration.tv_nsec/1000000000.0;
	}
	else
	{
		if (clock_gettime(CLOCK_MONOTONIC_RAW, &temp) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_OSTIME(("StopChrono error (%s) : %s"
				"(pChrono=%#x)\n", 
				strtime_m(), 
				GetLastErrorMsg(), 
				pChrono));
			return EXIT_FAILURE;
		}

		//pChrono->Duration += pChrono->Finish-pChrono->Start

		pChrono->Finish = temp;

		temp.tv_sec += pChrono->Duration.tv_sec; // Seconds.
		temp.tv_nsec += pChrono->Duration.tv_nsec; // Additional nanoseconds.
		// tv_nsec must stay in [0,1000000000].
		temp.tv_sec += temp.tv_nsec/1000000000;
		temp.tv_nsec = temp.tv_nsec%1000000000;

		temp.tv_sec -= pChrono->Start.tv_sec;
		temp.tv_nsec -= pChrono->Start.tv_nsec;
		// tv_nsec must stay in [0,1000000000].
		if (temp.tv_nsec < 0)
		{
			temp.tv_sec += -1+temp.tv_nsec/1000000000;
			temp.tv_nsec = 1000000000+temp.tv_nsec%1000000000;
		}

		pChrono->Duration = temp;

		*pDuration = pChrono->Duration.tv_sec+(double)pChrono->Duration.tv_nsec/1000000000.0;
	}

	return EXIT_SUCCESS;
}